

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyRoomListView.cpp
# Opt level: O1

void __thiscall EmptyRoomListView::getParams(EmptyRoomListView *this)

{
  char cVar1;
  int iVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Fill in the following details:\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Start time -> ",0xe);
  DateTime::inputValidate(&(this->params).start);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"End time -> ",0xc);
  DateTime::inputValidate(&(this->params).end);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter strength: ",0x10);
  iVar2 = Input::getInt();
  (this->params).strength = iVar2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Audio required? (y/n): ",0x17);
  cVar1 = Input::getChar();
  (this->params).audio = cVar1 == 'y';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Video required? (y/n): ",0x17);
  cVar1 = Input::getChar();
  (this->params).video = cVar1 == 'y';
  return;
}

Assistant:

void EmptyRoomListView::getParams() {
    cout << "Fill in the following details:\n"
         << "Start time -> ";
    params.start.inputValidate();
    cout << "End time -> ";
    params.end.inputValidate();
    cout << "Enter strength: ";
    params.strength = Input::getInt();
    cout << "Audio required? (y/n): ";
    params.audio = (Input::getChar() == 'y');
    cout << "Video required? (y/n): ";
    params.video = (Input::getChar() == 'y');
}